

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase82::run(TestCase82 *this)

{
  undefined1 in_CL;
  EncodingResult<kj::Array<char16_t>_> local_470;
  EncodingResult<kj::Array<char16_t>_> local_450;
  EncodingResult<kj::Array<char16_t>_> local_430;
  EncodingResult<kj::Array<char16_t>_> local_410;
  EncodingResult<kj::Array<char16_t>_> local_3f0;
  EncodingResult<kj::Array<char16_t>_> local_3d0;
  EncodingResult<kj::Array<char16_t>_> local_3b0;
  EncodingResult<kj::Array<char16_t>_> local_390;
  EncodingResult<kj::Array<char16_t>_> local_370;
  EncodingResult<kj::Array<char16_t>_> local_350;
  EncodingResult<kj::Array<char16_t>_> local_330;
  EncodingResult<kj::Array<char16_t>_> local_310;
  EncodingResult<kj::Array<char16_t>_> local_2f0;
  EncodingResult<kj::Array<char16_t>_> local_2d0;
  EncodingResult<kj::Array<char16_t>_> local_2b0;
  EncodingResult<kj::Array<char16_t>_> local_290;
  EncodingResult<kj::Array<char16_t>_> local_270;
  EncodingResult<kj::Array<char16_t>_> local_250;
  EncodingResult<kj::Array<char16_t>_> local_230;
  EncodingResult<kj::Array<char16_t>_> local_210;
  EncodingResult<kj::Array<char16_t>_> local_1f0;
  EncodingResult<kj::Array<char16_t>_> local_1d0;
  EncodingResult<kj::Array<char16_t>_> local_1b0;
  EncodingResult<kj::Array<char16_t>_> local_190;
  EncodingResult<kj::Array<char16_t>_> local_170;
  EncodingResult<kj::Array<char16_t>_> local_150;
  EncodingResult<kj::Array<char16_t>_> local_130;
  EncodingResult<kj::Array<char16_t>_> local_110;
  EncodingResult<kj::Array<char16_t>_> local_f0;
  EncodingResult<kj::Array<char16_t>_> local_d0;
  EncodingResult<kj::Array<char16_t>_> local_b0;
  EncodingResult<kj::Array<char16_t>_> local_90;
  EncodingResult<kj::Array<char16_t>_> local_70;
  EncodingResult<kj::Array<char16_t>_> local_50;
  EncodingResult<kj::Array<char16_t>_> local_30;
  
  encodeUtf16<2ul>(&local_30,(kj *)(anon_var_dwarf_11efa9 + 7),(char (*) [2])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_30,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_30.super_Array<char16_t>);
  encodeUtf16<4ul>(&local_50,(kj *)anon_var_dwarf_11ee0d,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,4ul>
            (&local_50,&anon_var_dwarf_11ee17,true);
  Array<char16_t>::~Array(&local_50.super_Array<char16_t>);
  encodeUtf16<6ul>(&local_70,(kj *)anon_var_dwarf_11ee21,(char (*) [6])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,4ul>
            (&local_70,&anon_var_dwarf_11ee17,true);
  Array<char16_t>::~Array(&local_70.super_Array<char16_t>);
  encodeUtf16<3ul>(&local_90,(kj *)anon_var_dwarf_11ee37,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_90,&anon_var_dwarf_11ee4d,true);
  Array<char16_t>::~Array(&local_90.super_Array<char16_t>);
  encodeUtf16<3ul>(&local_b0,(kj *)anon_var_dwarf_11ee63,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_b0,&anon_var_dwarf_11ee4d,true);
  Array<char16_t>::~Array(&local_b0.super_Array<char16_t>);
  encodeUtf16<4ul>(&local_d0,(kj *)anon_var_dwarf_11ee6d,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_d0,&anon_var_dwarf_11ee4d,true);
  Array<char16_t>::~Array(&local_d0.super_Array<char16_t>);
  encodeUtf16<3ul>(&local_f0,(kj *)anon_var_dwarf_11ee77,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_f0,&anon_var_dwarf_11ee4d,true);
  Array<char16_t>::~Array(&local_f0.super_Array<char16_t>);
  encodeUtf16<4ul>(&local_110,(kj *)anon_var_dwarf_11ee81,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_110,&anon_var_dwarf_11ee4d,true);
  Array<char16_t>::~Array(&local_110.super_Array<char16_t>);
  encodeUtf16<5ul>(&local_130,(kj *)anon_var_dwarf_11ee8b,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_130,&anon_var_dwarf_11ee4d,true);
  Array<char16_t>::~Array(&local_130.super_Array<char16_t>);
  encodeUtf16<3ul>(&local_150,(kj *)anon_var_dwarf_11eea1,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_150,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_150.super_Array<char16_t>);
  encodeUtf16<3ul>(&local_170,(kj *)anon_var_dwarf_11eeab,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_170,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_170.super_Array<char16_t>);
  encodeUtf16<3ul>(&local_190,(kj *)anon_var_dwarf_11eeb5,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_190,(char16_t (*) [2])L"\x80",false);
  Array<char16_t>::~Array(&local_190.super_Array<char16_t>);
  encodeUtf16<3ul>(&local_1b0,(kj *)anon_var_dwarf_11eec9,(char (*) [3])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_1b0,(char16_t (*) [2])L"߿",false);
  Array<char16_t>::~Array(&local_1b0.super_Array<char16_t>);
  encodeUtf16<4ul>(&local_1d0,(kj *)anon_var_dwarf_11eedd,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_1d0,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_1d0.super_Array<char16_t>);
  encodeUtf16<4ul>(&local_1f0,(kj *)anon_var_dwarf_11eee7,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_1f0,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_1f0.super_Array<char16_t>);
  encodeUtf16<4ul>(&local_210,(kj *)anon_var_dwarf_11eef1,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_210,(char16_t (*) [2])L"ࠀ",false);
  Array<char16_t>::~Array(&local_210.super_Array<char16_t>);
  encodeUtf16<4ul>(&local_230,(kj *)anon_var_dwarf_11ef05,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_230,(char16_t (*) [2])L"",false);
  Array<char16_t>::~Array(&local_230.super_Array<char16_t>);
  encodeUtf16<4ul>(&local_250,(kj *)anon_var_dwarf_11ef19,(char (*) [4])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_250,(char16_t (*) [2])L"\xffff",false);
  Array<char16_t>::~Array(&local_250.super_Array<char16_t>);
  encodeUtf16<5ul>(&local_270,(kj *)anon_var_dwarf_11ef2d,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_270,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_270.super_Array<char16_t>);
  encodeUtf16<5ul>(&local_290,(kj *)anon_var_dwarf_11ef37,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_290,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_290.super_Array<char16_t>);
  encodeUtf16<5ul>(&local_2b0,(kj *)anon_var_dwarf_11ef41,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_2b0,(char16_t (*) [3])L"𐀀",false);
  Array<char16_t>::~Array(&local_2b0.super_Array<char16_t>);
  encodeUtf16<5ul>(&local_2d0,(kj *)anon_var_dwarf_11ef55,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_2d0,(char16_t (*) [3])L"\x0010ffff",false);
  Array<char16_t>::~Array(&local_2d0.super_Array<char16_t>);
  encodeUtf16<5ul>(&local_2f0,(kj *)anon_var_dwarf_11ef69,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_2f0,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_2f0.super_Array<char16_t>);
  encodeUtf16<6ul>(&local_310,(kj *)anon_var_dwarf_11ef73,(char (*) [6])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_310,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_310.super_Array<char16_t>);
  encodeUtf16<7ul>(&local_330,(kj *)anon_var_dwarf_11ef7d,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_330,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_330.super_Array<char16_t>);
  encodeUtf16<8ul>(&local_350,(kj *)anon_var_dwarf_11ef93,(char (*) [8])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_350,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_350.super_Array<char16_t>);
  encodeUtf16<9ul>(&local_370,(kj *)anon_var_dwarf_11efa9,(char (*) [9])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,2ul>
            (&local_370,(char16_t (*) [2])(anon_var_dwarf_11f041 + 1),true);
  Array<char16_t>::~Array(&local_370.super_Array<char16_t>);
  encodeUtf16<7ul>(&local_390,(kj *)anon_var_dwarf_11efbf,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_390,&anon_var_dwarf_11efc9,true);
  Array<char16_t>::~Array(&local_390.super_Array<char16_t>);
  encodeUtf16<7ul>(&local_3b0,(kj *)anon_var_dwarf_11efd3,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_3b0,&anon_var_dwarf_11efdd,true);
  Array<char16_t>::~Array(&local_3b0.super_Array<char16_t>);
  encodeUtf16<7ul>(&local_3d0,(kj *)anon_var_dwarf_11efe7,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_3d0,&anon_var_dwarf_11eff1,true);
  Array<char16_t>::~Array(&local_3d0.super_Array<char16_t>);
  encodeUtf16<5ul>(&local_3f0,(kj *)anon_var_dwarf_11effb,(char (*) [5])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_3f0,&anon_var_dwarf_11f005,true);
  Array<char16_t>::~Array(&local_3f0.super_Array<char16_t>);
  encodeUtf16<6ul>(&local_410,(kj *)anon_var_dwarf_11f00f,(char (*) [6])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,4ul>
            (&local_410,&anon_var_dwarf_11f019,true);
  Array<char16_t>::~Array(&local_410.super_Array<char16_t>);
  encodeUtf16<9ul>(&local_430,(kj *)anon_var_dwarf_11f023,(char (*) [9])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,5ul>
            (&local_430,&anon_var_dwarf_11f02d,true);
  Array<char16_t>::~Array(&local_430.super_Array<char16_t>);
  encodeUtf16<7ul>(&local_450,(kj *)anon_var_dwarf_11f037,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_450,&anon_var_dwarf_11f041,true);
  Array<char16_t>::~Array(&local_450.super_Array<char16_t>);
  encodeUtf16<7ul>(&local_470,(kj *)anon_var_dwarf_11f04b,(char (*) [7])0x0,(bool)in_CL);
  (anonymous_namespace)::expectRes<kj::Array<char16_t>,char16_t,3ul>
            (&local_470,&anon_var_dwarf_11f055,true);
  Array<char16_t>::~Array(&local_470.super_Array<char16_t>);
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalWithValue) {
  // This tests that if we use sigqueue() to attach a value to the signal, that value is received
  // correctly.  Note that this only works on platforms that support real-time signals -- even
  // though the signal we're sending is SIGURG, the sigqueue() system call is introduced by RT
  // signals.  Hence this test won't run on e.g. Mac OSX.
  //
  // Also, Android's bionic does not appear to support sigqueue() even though the kernel does.
  //
  // Also, this test fails on Linux on mipsel. si_value comes back as zero. No one with a mips
  // machine wants to debug the problem but they demand a patch fixing it, so we disable the test.
  // Sad. https://github.com/sandstorm-io/capnproto/issues/204

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  union sigval value;
  memset(&value, 0, sizeof(value));
  value.sival_int = 123;
  KJ_SYSCALL_HANDLE_ERRORS(sigqueue(getpid(), SIGURG, value)) {
    case ENOSYS:
      // sigqueue() not supported. Maybe running on WSL.
      KJ_LOG(WARNING, "sigqueue() is not implemented by your system; skipping test");
      return;
    default:
      KJ_FAIL_SYSCALL("sigqueue(getpid(), SIGURG, value)", error);
  }

  siginfo_t info = port.onSignal(SIGURG).wait(waitScope);
  EXPECT_EQ(SIGURG, info.si_signo);
  EXPECT_SI_CODE(SI_QUEUE, info.si_code);
  EXPECT_EQ(123, info.si_value.sival_int);
}